

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O3

void __thiscall
sptk::reaper::EpochTracker::GetPulseCorrelations
          (EpochTracker *this,float window_dur,float peak_thresh)

{
  short *psVar1;
  float fVar2;
  pointer pfVar3;
  pointer pfVar4;
  pointer psVar5;
  int32_t iVar6;
  int iVar7;
  pointer pRVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int size;
  ulong uVar12;
  long lVar13;
  EpochTracker *this_00;
  int start;
  vector<float,_std::allocator<float>_> mixture;
  vector<float,_std::allocator<float>_> local_48;
  
  fVar2 = this->sample_rate_;
  iVar7 = (int)(fVar2 / this->max_f0_search_ + 0.5);
  this->first_nccf_lag_ = iVar7;
  iVar9 = (int)(fVar2 / this->min_f0_search_ + 0.5);
  this->n_nccf_lags_ = iVar9 - iVar7;
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize
            (&local_48,
             (long)(this->residual_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->residual_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  pfVar3 = (this->residual_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar11 = (long)(this->residual_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pfVar3;
  if (lVar11 != 0) {
    lVar11 = lVar11 >> 2;
    pfVar4 = (this->signal_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar13 = 0;
    do {
      local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar13] = pfVar3[lVar13] * 0.7 + pfVar4[lVar13] * 0.3;
      lVar13 = lVar13 + 1;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar13);
  }
  pRVar8 = (this->resid_peaks_).
           super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->resid_peaks_).
      super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
      ._M_impl.super__Vector_impl_data._M_finish != pRVar8) {
    size = (int)(fVar2 * window_dur + 0.5);
    iVar10 = (int)(this->sample_rate_ * 0.001 + 0.5);
    iVar7 = iVar10 * -2;
    uVar12 = 0;
    do {
      this_00 = (EpochTracker *)&pRVar8[uVar12].nccf;
      start = pRVar8[uVar12].resid_index - size / 2;
      if (start < 1) {
        start = 0;
      }
      if (((ulong)(long)(iVar9 + size + start) <
           (ulong)((long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2)) && (iVar10 <= start - iVar7)) {
        CrossCorrelation(this_00,&local_48,start,this->first_nccf_lag_,this->n_nccf_lags_,size,
                         (vector<float,_std::allocator<float>_> *)this_00);
        pRVar8 = (this->resid_peaks_).
                 super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        FindNccfPeaks(this_00,&pRVar8[uVar12].nccf,peak_thresh,&pRVar8[uVar12].nccf_periods);
        pRVar8 = (this->resid_peaks_).
                 super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar5 = pRVar8[uVar12].nccf_periods.super__Vector_base<short,_std::allocator<short>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar11 = (long)pRVar8[uVar12].nccf_periods.super__Vector_base<short,_std::allocator<short>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5;
        iVar7 = start;
        if (lVar11 != 0) {
          lVar11 = lVar11 >> 1;
          iVar6 = this->first_nccf_lag_;
          lVar13 = 0;
          do {
            psVar1 = psVar5 + lVar13;
            *psVar1 = *psVar1 + (short)iVar6;
            lVar13 = lVar13 + 1;
          } while (lVar11 + (ulong)(lVar11 == 0) != lVar13);
        }
      }
      else {
        std::vector<float,_std::allocator<float>_>::operator=
                  ((vector<float,_std::allocator<float>_> *)this_00,&pRVar8[uVar12 - 1].nccf);
        pRVar8 = (this->resid_peaks_).
                 super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::vector<short,_std::allocator<short>_>::operator=
                  (&pRVar8[uVar12].nccf_periods,&pRVar8[uVar12 - 1].nccf_periods);
        pRVar8 = (this->resid_peaks_).
                 super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)(((long)(this->resid_peaks_).
                                     super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8 >> 4)
                             * 0x6db6db6db6db6db7));
  }
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void EpochTracker::GetPulseCorrelations(float window_dur, float peak_thresh) {
  first_nccf_lag_ = RoundUp(sample_rate_ / max_f0_search_);
  int32_t max_lag = RoundUp(sample_rate_ / min_f0_search_);
  n_nccf_lags_ = max_lag - first_nccf_lag_;
  int32_t window_size = RoundUp(window_dur * sample_rate_);
  int32_t half_wind = window_size / 2;
  int32_t frame_size = window_size + max_lag;

  std::vector<float> mixture;
  mixture.resize(residual_.size());
  const float kMinCorrelationStep = 0.001;  // Pulse separation
  // before computing new
  // correlation values.
  const float kResidFract = 0.7;  // Fraction of the residual to use.
  const float kPcmFract = 1.0 - kResidFract;  // Fraction of the input to use.
  for (size_t i = 0; i < residual_.size(); ++i) {
    mixture[i] = (kResidFract * residual_[i]) + (kPcmFract * signal_[i]);
  }

  int32_t min_step = RoundUp(sample_rate_ * kMinCorrelationStep);
  int32_t old_start = - (2.0 * min_step);
  for (size_t peak = 0; peak < resid_peaks_.size(); ++peak) {
    int32_t start = resid_peaks_[peak].resid_index - half_wind;
    if (start < 0) {
      start = 0;
    }
    size_t end = start + frame_size;
    if ((end >= mixture.size()) || ((start - old_start) < min_step)) {
      resid_peaks_[peak].nccf = resid_peaks_[peak - 1].nccf;
      resid_peaks_[peak].nccf_periods = resid_peaks_[peak - 1].nccf_periods;
    } else {
      CrossCorrelation(mixture, start, first_nccf_lag_, n_nccf_lags_,
                       window_size, &(resid_peaks_[peak].nccf));
      FindNccfPeaks(resid_peaks_[peak].nccf, peak_thresh,
                    &(resid_peaks_[peak].nccf_periods));
      // Turn the peak indices from FindNccfPeaks into NCCF period hyps.
      for (size_t i = 0; i < resid_peaks_[peak].nccf_periods.size(); ++i) {
        resid_peaks_[peak].nccf_periods[i] += first_nccf_lag_;
      }
      old_start = start;
    }
  }
}